

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# val_VecStr.cpp
# Opt level: O0

string * __thiscall mbc::Val::VecStr::raw_abi_cxx11_(VecStr *this)

{
  element_type *peVar1;
  string local_40 [32];
  undefined1 local_20 [8];
  shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> value
  ;
  VecStr *this_local;
  
  value.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  (*(this->super__ValAtom).super_ValBase._vptr_ValBase[3])();
  std::make_shared<std::__cxx11::string,std::__cxx11::string_const>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20);
  std::__cxx11::string::~string(local_40);
  peVar1 = std::
           __shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*((__shared_ptr_access<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)local_20);
  std::shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~shared_ptr((shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)local_20);
  return peVar1;
}

Assistant:

const string& VecStr::raw() const {
    shared_ptr<string> value = std::make_shared<string>(str_());
    return *value;
}